

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alconfig.cpp
# Opt level: O1

char * GetConfigValue(char *devName,char *blockName,char *keyName,char *def)

{
  ConfigEntry *pCVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  __normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
  _Var5;
  long lVar6;
  __normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
  __it;
  __normal_iterator<const_(anonymous_namespace)::ConfigEntry_*,_std::vector<(anonymous_namespace)::ConfigEntry,_al::allocator<(anonymous_namespace)::ConfigEntry,_8UL>_>_>
  __it_00;
  string key;
  undefined1 **local_68;
  undefined1 *local_60;
  char *local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  char *local_40;
  char *local_38;
  
  if (keyName == (char *)0x0) {
    return def;
  }
  local_60 = &local_50;
  local_58 = (char *)0x0;
  local_50 = 0;
  if ((blockName == (char *)0x0) ||
     (iVar4 = al::strcasecmp(blockName,"general"), pcVar2 = local_58, iVar4 == 0)) {
    pcVar2 = local_58;
    if (devName != (char *)0x0) {
      strlen(devName);
      std::__cxx11::string::_M_replace((ulong)&local_60,0,pcVar2,(ulong)devName);
      goto LAB_0013cd22;
    }
  }
  else {
    strlen(blockName);
    std::__cxx11::string::_M_replace((ulong)&local_60,0,pcVar2,(ulong)blockName);
    if (devName != (char *)0x0) {
      std::__cxx11::string::push_back((char)&local_60);
      std::__cxx11::string::append((char *)&local_60);
    }
LAB_0013cd22:
    std::__cxx11::string::push_back((char)&local_60);
  }
  std::__cxx11::string::append((char *)&local_60);
  pCVar1 = DAT_001b2de8;
  lVar6 = (long)DAT_001b2de8 - (long)(anonymous_namespace)::ConfOpts >> 8;
  __it_00._M_current = (anonymous_namespace)::ConfOpts;
  local_68 = &local_60;
  local_40 = blockName;
  local_38 = keyName;
  if (0 < lVar6) {
    __it_00._M_current =
         (ConfigEntry *)
         ((long)&((anonymous_namespace)::ConfOpts->key)._M_dataplus._M_p +
         ((long)DAT_001b2de8 - (long)(anonymous_namespace)::ConfOpts & 0xffffffffffffff00U));
    lVar6 = lVar6 + 1;
    __it._M_current = (anonymous_namespace)::ConfOpts;
    do {
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::$_0>::
              operator()((_Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::__0>
                          *)&local_68,__it);
      _Var5._M_current = __it._M_current;
      if (bVar3) goto LAB_0013ce71;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::$_0>::
              operator()((_Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::__0>
                          *)&local_68,__it._M_current + 1);
      _Var5._M_current = __it._M_current + 1;
      if (bVar3) goto LAB_0013ce71;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::$_0>::
              operator()((_Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::__0>
                          *)&local_68,__it._M_current + 2);
      _Var5._M_current = __it._M_current + 2;
      if (bVar3) goto LAB_0013ce71;
      bVar3 = __gnu_cxx::__ops::
              _Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::$_0>::
              operator()((_Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::__0>
                          *)&local_68,__it._M_current + 3);
      _Var5._M_current = __it._M_current + 3;
      if (bVar3) goto LAB_0013ce71;
      __it._M_current = __it._M_current + 4;
      lVar6 = lVar6 + -1;
    } while (1 < lVar6);
  }
  lVar6 = (long)pCVar1 - (long)__it_00._M_current >> 6;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      _Var5._M_current = pCVar1;
      if ((lVar6 != 3) ||
         (bVar3 = __gnu_cxx::__ops::
                  _Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::$_0>::
                  operator()((_Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::__0>
                              *)&local_68,__it_00), _Var5._M_current = __it_00._M_current, bVar3))
      goto LAB_0013ce71;
      __it_00._M_current = __it_00._M_current + 1;
    }
    bVar3 = __gnu_cxx::__ops::
            _Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::$_0>::
            operator()((_Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::__0>
                        *)&local_68,__it_00);
    _Var5._M_current = __it_00._M_current;
    if (bVar3) goto LAB_0013ce71;
    __it_00._M_current = __it_00._M_current + 1;
  }
  bVar3 = __gnu_cxx::__ops::
          _Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::$_0>::
          operator()((_Iter_pred<GetConfigValue(char_const*,char_const*,char_const*,char_const*)::__0>
                      *)&local_68,__it_00);
  _Var5._M_current = __it_00._M_current;
  if (!bVar3) {
    _Var5._M_current = pCVar1;
  }
LAB_0013ce71:
  if (_Var5._M_current == pCVar1) {
    if (devName == (char *)0x0) {
      if (2 < (int)gLogLevel) {
        GetConfigValue();
      }
    }
    else {
      def = GetConfigValue((char *)0x0,local_40,local_38,def);
    }
  }
  else {
    if (2 < (int)gLogLevel) {
      fprintf((FILE *)gLogFile,"[ALSOFT] (II) Found %s = \"%s\"\n",local_60,
              ((_Var5._M_current)->value)._M_dataplus._M_p);
    }
    if (((_Var5._M_current)->value)._M_string_length != 0) {
      def = ((_Var5._M_current)->value)._M_dataplus._M_p;
    }
  }
  if (local_60 != &local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  return def;
}

Assistant:

const char *GetConfigValue(const char *devName, const char *blockName, const char *keyName, const char *def)
{
    if(!keyName)
        return def;

    std::string key;
    if(blockName && al::strcasecmp(blockName, "general") != 0)
    {
        key = blockName;
        if(devName)
        {
            key += '/';
            key += devName;
        }
        key += '/';
        key += keyName;
    }
    else
    {
        if(devName)
        {
            key = devName;
            key += '/';
        }
        key += keyName;
    }

    auto iter = std::find_if(ConfOpts.cbegin(), ConfOpts.cend(),
        [&key](const ConfigEntry &entry) -> bool
        { return entry.key == key; }
    );
    if(iter != ConfOpts.cend())
    {
        TRACE("Found %s = \"%s\"\n", key.c_str(), iter->value.c_str());
        if(!iter->value.empty())
            return iter->value.c_str();
        return def;
    }

    if(!devName)
    {
        TRACE("Key %s not found\n", key.c_str());
        return def;
    }
    return GetConfigValue(nullptr, blockName, keyName, def);
}